

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O2

_Bool store_get_check(char *prompt)

{
  uint uVar1;
  _Bool _Var2;
  keypress kVar3;
  
  _Var2 = false;
  prt(prompt,L'\0',L'\0');
  kVar3 = inkey();
  prt("",L'\0',L'\0');
  if ((kVar3._0_8_ >> 0x20 != 0xe000) &&
     ((((char)kVar3.code == '\0' || (uVar1 = kVar3.code & 0xff, uVar1 == 0x6e)) ||
      (_Var2 = true, uVar1 == 0x4e)))) {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

static bool store_get_check(const char *prompt)
{
	struct keypress ch;

	/* Prompt for it */
	prt(prompt, 0, 0);

	/* Get an answer */
	ch = inkey();

	/* Erase the prompt */
	prt("", 0, 0);

	if (ch.code == ESCAPE) return (false);
	if (strchr("Nn", ch.code)) return (false);

	/* Success */
	return (true);
}